

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void __thiscall
cubeb_basic_stream_operations_Test::TestBody(cubeb_basic_stream_operations_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint32_t latency;
  uint64_t position;
  cubeb_stream_params params;
  cubeb_stream *stream;
  cubeb *ctx;
  int r;
  cubeb_stream *stream_00;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffd84;
  int *in_stack_fffffffffffffd88;
  code *expected;
  Message *in_stack_fffffffffffffd90;
  code *this_00;
  char *in_stack_fffffffffffffd98;
  int *expected_expression;
  AssertHelper local_260;
  Message local_258;
  undefined4 local_24c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdc0;
  AssertHelper in_stack_fffffffffffffdc8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  char *in_stack_fffffffffffffde0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffde8;
  AssertHelper in_stack_fffffffffffffdf0;
  Message local_208;
  undefined4 local_1fc;
  AssertionResult local_1f8;
  AssertHelper local_1e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe28;
  cubeb_data_callback in_stack_fffffffffffffe30;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe38;
  AssertHelper in_stack_fffffffffffffe40;
  Message local_1b8;
  undefined4 local_1ac;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined4 local_184;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_134;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  undefined8 local_e8;
  AssertionResult local_e0;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  AssertionResult local_b8;
  AssertHelper local_a8;
  Message local_a0;
  undefined8 local_98;
  AssertionResult local_90;
  uint local_7c;
  AssertHelper local_78;
  Message local_70;
  undefined4 local_64;
  AssertionResult local_60 [2];
  cubeb_stream local_3c;
  undefined4 local_2c;
  int local_14;
  
  local_14 = common_init((cubeb **)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
  local_64 = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
  if (!bVar1) {
    testing::Message::Message(in_stack_fffffffffffffd90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c3c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,0x196,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x10c410);
  }
  local_7c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c435);
  if (local_7c == 0) {
    local_98 = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               (char *)in_stack_fffffffffffffdd0.ptr_,(cubeb **)in_stack_fffffffffffffdc8.data_,
               (void **)in_stack_fffffffffffffdc0.ptr_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
    if (!bVar1) {
      testing::Message::Message(in_stack_fffffffffffffd90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c4ad);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,0x197,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::Message::~Message((Message *)0x10c4fd);
    }
    local_7c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c522);
    if (local_7c == 0) {
      local_3c.context._0_4_ = 0;
      local_3c.context._4_4_ = 0xac44;
      local_3c.user_ptr._0_4_ = 1;
      local_3c.user_ptr._4_4_ = 4;
      local_2c = 0;
      stream_00 = &local_3c;
      uVar3 = 0x113a;
      expected = test_data_callback;
      this_00 = test_state_callback;
      expected_expression = &dummy;
      local_14 = cubeb_stream_init((cubeb *)in_stack_fffffffffffffdf0.data_,
                                   (cubeb_stream **)in_stack_fffffffffffffde8.ptr_,
                                   in_stack_fffffffffffffde0,
                                   (cubeb_devid)
                                   CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                                   (cubeb_stream_params *)in_stack_fffffffffffffdd0.ptr_,
                                   in_stack_fffffffffffffdc8.data_,
                                   (cubeb_stream_params *)in_stack_fffffffffffffe20.ptr_,
                                   in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,
                                   (cubeb_state_callback)in_stack_fffffffffffffe38.ptr_,
                                   in_stack_fffffffffffffe40.data_);
      local_bc = 0;
      testing::internal::EqHelper<false>::Compare<int,__0>
                ((char *)expected_expression,(char *)this_00,(int *)expected,
                 (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffd84,uVar3));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c636);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                   ,0x1a1,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        testing::Message::~Message((Message *)0x10c686);
      }
      local_7c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c6ab);
      if (local_7c == 0) {
        local_e8 = 0;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  ((char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   (char *)in_stack_fffffffffffffdd0.ptr_,
                   (cubeb_stream **)in_stack_fffffffffffffdc8.data_,
                   (void **)in_stack_fffffffffffffdc0.ptr_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
        if (!bVar1) {
          testing::Message::Message((Message *)this_00);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c723);
          testing::internal::AssertHelper::AssertHelper
                    (&local_f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                     ,0x1a2,pcVar2);
          testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
          testing::internal::AssertHelper::~AssertHelper(&local_f8);
          testing::Message::~Message((Message *)0x10c773);
        }
        local_7c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c798);
        if (local_7c == 0) {
          local_14 = cubeb_stream_get_position(stream_00,(uint64_t *)0x10c7bf);
          local_10c = 0;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    ((char *)expected_expression,(char *)this_00,(int *)expected,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffd84,uVar3));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
          if (!bVar1) {
            testing::Message::Message((Message *)this_00);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c82b);
            testing::internal::AssertHelper::AssertHelper
                      (&local_120,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                       ,0x1a6,pcVar2);
            testing::internal::AssertHelper::operator=(&local_120,&local_118);
            testing::internal::AssertHelper::~AssertHelper(&local_120);
            testing::Message::~Message((Message *)0x10c87b);
          }
          local_7c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c8a0);
          if (local_7c == 0) {
            local_134 = 0;
            testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
                      ((char *)expected_expression,(char *)this_00,(unsigned_long *)expected,
                       (uint *)CONCAT44(in_stack_fffffffffffffd84,uVar3));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
            if (!bVar1) {
              testing::Message::Message((Message *)this_00);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c917);
              testing::internal::AssertHelper::AssertHelper
                        (&local_148,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                         ,0x1a7,pcVar2);
              testing::internal::AssertHelper::operator=(&local_148,&local_140);
              testing::internal::AssertHelper::~AssertHelper(&local_148);
              testing::Message::~Message((Message *)0x10c967);
            }
            local_7c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c98c);
            if (local_7c == 0) {
              local_14 = cubeb_stream_get_latency(stream_00,(uint32_t *)0x10c9b3);
              local_15c = 0;
              testing::internal::EqHelper<false>::Compare<int,__0>
                        ((char *)expected_expression,(char *)this_00,(int *)expected,
                         (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffd84,uVar3));
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
              if (!bVar1) {
                testing::Message::Message((Message *)this_00);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10ca1f);
                testing::internal::AssertHelper::AssertHelper
                          (&local_170,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                           ,0x1aa,pcVar2);
                testing::internal::AssertHelper::operator=(&local_170,&local_168);
                testing::internal::AssertHelper::~AssertHelper(&local_170);
                testing::Message::~Message((Message *)0x10ca6f);
              }
              local_7c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ca94);
              if (local_7c == 0) {
                local_14 = cubeb_stream_start(stream_00);
                local_184 = 0;
                testing::internal::EqHelper<false>::Compare<int,__0>
                          ((char *)expected_expression,(char *)this_00,(int *)expected,
                           (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffd84,uVar3));
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
                if (!bVar1) {
                  testing::Message::Message((Message *)this_00);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10cb1f);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_198,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                             ,0x1ad,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_198,&local_190);
                  testing::internal::AssertHelper::~AssertHelper(&local_198);
                  testing::Message::~Message((Message *)0x10cb6f);
                }
                local_7c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cb94);
                if (local_7c == 0) {
                  local_14 = cubeb_stream_get_position(stream_00,(uint64_t *)0x10cbbb);
                  local_1ac = 0;
                  testing::internal::EqHelper<false>::Compare<int,__0>
                            ((char *)expected_expression,(char *)this_00,(int *)expected,
                             (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffd84,uVar3));
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
                  if (!bVar1) {
                    testing::Message::Message((Message *)this_00);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10cc27);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&stack0xfffffffffffffe40,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                               ,0x1b1,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&stack0xfffffffffffffe40,&local_1b8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&stack0xfffffffffffffe40);
                    testing::Message::~Message((Message *)0x10cc77);
                  }
                  local_7c = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cc9c);
                  if (local_7c == 0) {
                    local_14 = cubeb_stream_get_latency(stream_00,(uint32_t *)0x10ccc3);
                    testing::internal::EqHelper<false>::Compare<int,__0>
                              ((char *)expected_expression,(char *)this_00,(int *)expected,
                               (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffd84,uVar3));
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)&stack0xfffffffffffffe30);
                    if (!bVar1) {
                      testing::Message::Message((Message *)this_00);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)0x10cd2f);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_1e8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                                 ,0x1b4,pcVar2);
                      testing::internal::AssertHelper::operator=
                                (&local_1e8,(Message *)&stack0xfffffffffffffe20);
                      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
                      testing::Message::~Message((Message *)0x10cd7f);
                    }
                    local_7c = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cda4);
                    if (local_7c == 0) {
                      local_14 = cubeb_stream_stop(stream_00);
                      local_1fc = 0;
                      testing::internal::EqHelper<false>::Compare<int,__0>
                                ((char *)expected_expression,(char *)this_00,(int *)expected,
                                 (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffd84,uVar3));
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f8);
                      if (!bVar1) {
                        testing::Message::Message((Message *)this_00);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)0x10ce2f);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&stack0xfffffffffffffdf0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                                   ,0x1b7,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&stack0xfffffffffffffdf0,&local_208);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&stack0xfffffffffffffdf0);
                        testing::Message::~Message((Message *)0x10ce76);
                      }
                      local_7c = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ce9b);
                      if (local_7c == 0) {
                        local_14 = cubeb_stream_get_position(stream_00,(uint64_t *)0x10cec2);
                        testing::internal::EqHelper<false>::Compare<int,__0>
                                  ((char *)expected_expression,(char *)this_00,(int *)expected,
                                   (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffd84,uVar3));
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)&stack0xfffffffffffffde0);
                        if (!bVar1) {
                          testing::Message::Message((Message *)this_00);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)0x10cf1c);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&stack0xfffffffffffffdc8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                                     ,0x1bb,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&stack0xfffffffffffffdc8,
                                     (Message *)&stack0xfffffffffffffdd0);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&stack0xfffffffffffffdc8);
                          testing::Message::~Message((Message *)0x10cf5d);
                        }
                        local_7c = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cf7f);
                        if (local_7c == 0) {
                          local_14 = cubeb_stream_get_latency(stream_00,(uint32_t *)0x10cfa6);
                          local_24c = 0;
                          testing::internal::EqHelper<false>::Compare<int,__0>
                                    ((char *)expected_expression,(char *)this_00,(int *)expected,
                                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffd84,uVar3));
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)&stack0xfffffffffffffdb8);
                          if (!bVar1) {
                            testing::Message::Message((Message *)this_00);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)0x10d000);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_260,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                                       ,0x1be,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_260,&local_258);
                            testing::internal::AssertHelper::~AssertHelper(&local_260);
                            testing::Message::~Message((Message *)0x10d041);
                          }
                          local_7c = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d063);
                          if (local_7c == 0) {
                            cubeb_stream_destroy((cubeb_stream *)0x10d07f);
                            cubeb_destroy((cubeb *)0x10d08c);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, basic_stream_operations)
{
  int r;
  cubeb * ctx;
  cubeb_stream * stream;
  cubeb_stream_params params;
  uint64_t position;
  uint32_t latency;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                        test_data_callback, test_state_callback, &dummy);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(stream, nullptr);

  /* position and latency before stream has started */
  r = cubeb_stream_get_position(stream, &position);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_EQ(position, 0u);

  r = cubeb_stream_get_latency(stream, &latency);
  ASSERT_EQ(r, CUBEB_OK);

  r = cubeb_stream_start(stream);
  ASSERT_EQ(r, CUBEB_OK);

  /* position and latency after while stream running */
  r = cubeb_stream_get_position(stream, &position);
  ASSERT_EQ(r, CUBEB_OK);

  r = cubeb_stream_get_latency(stream, &latency);
  ASSERT_EQ(r, CUBEB_OK);

  r = cubeb_stream_stop(stream);
  ASSERT_EQ(r, CUBEB_OK);

  /* position and latency after stream has stopped */
  r = cubeb_stream_get_position(stream, &position);
  ASSERT_EQ(r, CUBEB_OK);

  r = cubeb_stream_get_latency(stream, &latency);
  ASSERT_EQ(r, CUBEB_OK);

  cubeb_stream_destroy(stream);
  cubeb_destroy(ctx);
}